

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

void stbi_decode_DXT1_block(uchar *uncompressed,uchar *compressed)

{
  uint c;
  int iVar1;
  byte local_48 [4];
  int idx;
  uchar decode_colors [16];
  int c1;
  int c0;
  int b;
  int g;
  int r;
  int i;
  int next_bit;
  uchar *compressed_local;
  uchar *uncompressed_local;
  
  r = 0x20;
  c = (uint)*compressed + (uint)compressed[1] * 0x100;
  decode_colors._12_4_ = (uint)compressed[2] + (uint)compressed[3] * 0x100;
  _i = compressed;
  compressed_local = uncompressed;
  stbi_rgb_888_from_565(c,&b,&c0,&c1);
  local_48[0] = (byte)b;
  local_48[1] = (byte)c0;
  local_48[2] = (byte)c1;
  local_48[3] = 0xff;
  stbi_rgb_888_from_565(decode_colors._12_4_,&b,&c0,&c1);
  idx._0_1_ = (char)b;
  idx._1_1_ = (char)c0;
  idx._2_1_ = (char)c1;
  idx._3_1_ = 0xff;
  if ((int)decode_colors._12_4_ < (int)c) {
    decode_colors[0] = (uchar)((ulong)((uint)local_48[0] * 2 + (b & 0xffU)) / 3);
    decode_colors[1] = (uchar)((ulong)((uint)local_48[1] * 2 + (c0 & 0xffU)) / 3);
    decode_colors[2] = (uchar)((ulong)((uint)local_48[2] * 2 + (c1 & 0xffU)) / 3);
    decode_colors[3] = 0xff;
    decode_colors[4] = (uchar)((ulong)((uint)local_48[0] + (b & 0xffU) * 2) / 3);
    decode_colors[5] = (uchar)((ulong)((uint)local_48[1] + (c0 & 0xffU) * 2) / 3);
    decode_colors[6] = (uchar)((ulong)((uint)local_48[2] + (c1 & 0xffU) * 2) / 3);
    decode_colors[7] = 0xff;
  }
  else {
    decode_colors[0] = (uchar)((ulong)((uint)local_48[0] + (b & 0xffU)) / 2);
    decode_colors[1] = (uchar)((ulong)((uint)local_48[1] + (c0 & 0xffU)) / 2);
    decode_colors[2] = (uchar)((ulong)((uint)local_48[2] + (c1 & 0xffU)) / 2);
    decode_colors[3] = 0xff;
    decode_colors[4] = '\0';
    decode_colors[5] = '\0';
    decode_colors[6] = '\0';
    decode_colors[7] = '\0';
  }
  for (g = 0; g < 0x40; g = g + 4) {
    iVar1 = ((int)(uint)_i[r >> 3] >> ((byte)r & 7) & 3U) * 4;
    r = r + 2;
    compressed_local[g] = local_48[iVar1];
    compressed_local[g + 1] = local_48[iVar1 + 1];
    compressed_local[g + 2] = local_48[iVar1 + 2];
    compressed_local[g + 3] = local_48[iVar1 + 3];
  }
  return;
}

Assistant:

void stbi_decode_DXT1_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*4];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	decode_colors[3] = 255;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[4] = r;
	decode_colors[5] = g;
	decode_colors[6] = b;
	decode_colors[7] = 255;
	if( c0 > c1 )
	{
		//	no alpha, 2 interpolated colors
		decode_colors[8] = (2*decode_colors[0] + decode_colors[4]) / 3;
		decode_colors[9] = (2*decode_colors[1] + decode_colors[5]) / 3;
		decode_colors[10] = (2*decode_colors[2] + decode_colors[6]) / 3;
		decode_colors[11] = 255;
		decode_colors[12] = (decode_colors[0] + 2*decode_colors[4]) / 3;
		decode_colors[13] = (decode_colors[1] + 2*decode_colors[5]) / 3;
		decode_colors[14] = (decode_colors[2] + 2*decode_colors[6]) / 3;
		decode_colors[15] = 255;
	} else
	{
		//	1 interpolated color, alpha
		decode_colors[8] = (decode_colors[0] + decode_colors[4]) / 2;
		decode_colors[9] = (decode_colors[1] + decode_colors[5]) / 2;
		decode_colors[10] = (decode_colors[2] + decode_colors[6]) / 2;
		decode_colors[11] = 255;
		decode_colors[12] = 0;
		decode_colors[13] = 0;
		decode_colors[14] = 0;
		decode_colors[15] = 0;
	}
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 4;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
		uncompressed[i+3] = decode_colors[idx+3];
	}
	//	done
}